

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double calc_frame_boost(PRIMARY_RATE_CONTROL *p_rc,FRAME_INFO *frame_info,
                       FIRSTPASS_STATS *this_frame,double this_frame_mv_in_out,double max_boost)

{
  long in_RDX;
  FRAME_INFO *in_RSI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double active_area;
  double boost_q_correction;
  double lq;
  double frame_boost;
  aom_bit_depth_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  FRAME_INFO *in_stack_ffffffffffffff90;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_30;
  
  dVar1 = av1_convert_qindex_to_q(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  if (1.5 <= dVar1 * 0.015 + 0.5) {
    local_50 = 1.5;
  }
  else {
    local_50 = dVar1 * 0.015 + 0.5;
  }
  dVar1 = calculate_active_area
                    (in_stack_ffffffffffffff90,
                     (FIRSTPASS_STATS *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  dVar2 = baseline_err_per_mb(in_RSI);
  if (dVar2 * dVar1 <= *(double *)(in_RDX + 0x10) * dVar1) {
    local_58 = *(double *)(in_RDX + 0x10);
  }
  else {
    local_58 = baseline_err_per_mb(in_RSI);
  }
  local_58 = local_58 * dVar1;
  if (0.0 < *(double *)(in_RDX + 0x20) || *(double *)(in_RDX + 0x20) == 0.0) {
    local_68 = *(double *)(in_RDX + 0x20) + 1e-06;
  }
  else {
    local_68 = *(double *)(in_RDX + 0x20) - 1e-06;
  }
  local_30 = (local_58 / local_68) * 12.5 * local_50;
  if (in_XMM0_Qa <= 0.0) {
    dVar1 = in_XMM0_Qa / 2.0;
  }
  else {
    dVar1 = in_XMM0_Qa * 2.0;
  }
  local_30 = local_30 * dVar1 + local_30;
  if (in_XMM1_Qa * local_50 <= local_30) {
    local_30 = in_XMM1_Qa * local_50;
  }
  return local_30;
}

Assistant:

static double calc_frame_boost(const PRIMARY_RATE_CONTROL *p_rc,
                               const FRAME_INFO *frame_info,
                               const FIRSTPASS_STATS *this_frame,
                               double this_frame_mv_in_out, double max_boost) {
  double frame_boost;
  const double lq = av1_convert_qindex_to_q(p_rc->avg_frame_qindex[INTER_FRAME],
                                            frame_info->bit_depth);
  const double boost_q_correction = AOMMIN((0.5 + (lq * 0.015)), 1.5);
  const double active_area = calculate_active_area(frame_info, this_frame);

  // Underlying boost factor is based on inter error ratio.
  frame_boost = AOMMAX(baseline_err_per_mb(frame_info) * active_area,
                       this_frame->intra_error * active_area) /
                DOUBLE_DIVIDE_CHECK(this_frame->coded_error);
  frame_boost = frame_boost * BOOST_FACTOR * boost_q_correction;

  // Increase boost for frames where new data coming into frame (e.g. zoom out).
  // Slightly reduce boost if there is a net balance of motion out of the frame
  // (zoom in). The range for this_frame_mv_in_out is -1.0 to +1.0.
  if (this_frame_mv_in_out > 0.0)
    frame_boost += frame_boost * (this_frame_mv_in_out * 2.0);
  // In the extreme case the boost is halved.
  else
    frame_boost += frame_boost * (this_frame_mv_in_out / 2.0);

  return AOMMIN(frame_boost, max_boost * boost_q_correction);
}